

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_WhenAFieldNameIsRedefinedItsOldDefinitionIsRemoved_Test::
~ExtendedDataDictionaryTest_WhenAFieldNameIsRedefinedItsOldDefinitionIsRemoved_Test
          (ExtendedDataDictionaryTest_WhenAFieldNameIsRedefinedItsOldDefinitionIsRemoved_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest, WhenAFieldNameIsRedefinedItsOldDefinitionIsRemoved)
{
    ExtendableDataDictionary extendable_data_dictionary4 = CreateExtendableDataDictionary();
    FieldDef redefined(bid2.fid_, FieldTypeEnum::DOUBLE, "BidPrice", FieldEncodingEnum::FIXED1, 1);
    extendable_data_dictionary4.AddFieldDef(redefined);
    ASSERT_FALSE(extendable_data_dictionary4.FieldDefByName(bid2.name_));
    std::vector<FieldDef> actual = {redefined, ask2, bid_size2, ask_size2, status2};
    ASSERT_EQ(actual, extendable_data_dictionary4.AllFieldDefs());
}